

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void __thiscall
glcts::anon_unknown_0::ShaderKey::ShaderKey
          (ShaderKey *this,GLenum _stage,string *_input,string *_output)

{
  pointer pcVar1;
  
  this->stage = _stage;
  (this->input)._M_dataplus._M_p = (pointer)&(this->input).field_2;
  pcVar1 = (_input->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->input,pcVar1,pcVar1 + _input->_M_string_length);
  (this->output)._M_dataplus._M_p = (pointer)&(this->output).field_2;
  pcVar1 = (_output->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->output,pcVar1,pcVar1 + _output->_M_string_length);
  return;
}

Assistant:

ShaderKey(GLenum _stage, const std::string& _input, const std::string& _output)
		: stage(_stage), input(_input), output(_output)
	{
	}